

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O2

bool __thiscall
cmInstallImportedRuntimeArtifactsGenerator::Compute
          (cmInstallImportedRuntimeArtifactsGenerator *this,cmLocalGenerator *lg)

{
  bool bVar1;
  cmGeneratorTarget *pcVar2;
  
  pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(lg,&this->TargetName);
  this->Target = pcVar2;
  if ((pcVar2 != (cmGeneratorTarget *)0x0) && (bVar1 = cmGeneratorTarget::IsImported(pcVar2), bVar1)
     ) {
    return true;
  }
  pcVar2 = cmGlobalGenerator::FindGeneratorTarget(lg->GlobalGenerator,&this->TargetName);
  this->Target = pcVar2;
  return true;
}

Assistant:

bool cmInstallImportedRuntimeArtifactsGenerator::Compute(cmLocalGenerator* lg)
{
  // Lookup this target in the current directory.
  this->Target = lg->FindGeneratorTargetToUse(this->TargetName);
  if (!this->Target || !this->Target->IsImported()) {
    // If no local target has been found, find it in the global scope.
    this->Target =
      lg->GetGlobalGenerator()->FindGeneratorTarget(this->TargetName);
  }

  return true;
}